

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscSim.c
# Opt level: O2

void Ssc_GiaPrintPiPatterns(Gia_Man_t *p)

{
  Gia_Obj_t *pObj;
  int i;
  int v;
  
  v = 0;
  while( true ) {
    if (p->vCis->nSize <= v) {
      return;
    }
    pObj = Gia_ManCi(p,v);
    if (pObj == (Gia_Obj_t *)0x0) break;
    Gia_ObjSimObj(p,pObj);
    v = v + 1;
  }
  return;
}

Assistant:

void Ssc_GiaPrintPiPatterns( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    word * pSimAig;
    int i;//, nWords = Gia_ObjSimWords( p );
    Gia_ManForEachCi( p, pObj, i )
    {
        pSimAig = Gia_ObjSimObj( p, pObj );
//        Extra_PrintBinary( stdout, pSimAig, 64 * nWords );
    }
}